

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O0

Ref<embree::SceneGraph::MaterialNode> __thiscall
embree::XMLLoader::loadMaterial(XMLLoader *this,Ref<embree::XML> *xml)

{
  bool bVar1;
  ostream *poVar2;
  _func_int **pp_Var3;
  mapped_type *pmVar4;
  char *pcVar5;
  key_type *__k;
  mapped_type *pmVar6;
  undefined8 *in_RDX;
  MaterialNode *in_RDI;
  Ref<embree::SceneGraph::MaterialNode> material;
  Parms parms;
  string type;
  Ref<embree::XML> parameters;
  string id;
  Parms *in_stack_00000368;
  string *in_stack_00000370;
  XMLLoader *in_stack_00000378;
  Ref<embree::XML> *in_stack_00000608;
  XMLLoader *in_stack_00000610;
  map<embree::Ref<embree::XML>,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<embree::Ref<embree::XML>_>,_std::allocator<std::pair<const_embree::Ref<embree::XML>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
  *in_stack_fffffffffffffc18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc20;
  string *in_stack_fffffffffffffc28;
  XML *in_stack_fffffffffffffc30;
  key_type *in_stack_fffffffffffffc58;
  MatteMaterial *in_stack_fffffffffffffc60;
  key_type *this_00;
  XML *in_stack_fffffffffffffc68;
  Ref<embree::XML> *xml_00;
  XMLLoader *in_stack_fffffffffffffc90;
  string *in_stack_fffffffffffffcd8;
  XML *in_stack_fffffffffffffce0;
  bool local_2da;
  long *local_2b0 [7];
  allocator local_272;
  allocator local_271;
  string local_270 [32];
  long *local_250;
  string local_248 [32];
  string local_228 [32];
  _Self local_208;
  _Self local_200;
  allocator local_1f1;
  string local_1f0 [32];
  long *local_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  allocator local_1a9;
  string local_1a8 [36];
  undefined4 local_184;
  _Self local_180;
  _Self local_178 [3];
  allocator local_159;
  string local_158 [32];
  string local_138 [32];
  undefined8 *local_118;
  undefined8 *local_100;
  undefined8 *local_f8;
  undefined8 *local_f0;
  undefined4 local_dc;
  undefined4 local_d8;
  undefined4 local_d4;
  undefined8 *local_d0;
  long **local_c8;
  long **local_b8;
  mapped_type *local_a8;
  mapped_type *local_98;
  mapped_type *local_88;
  _func_int **local_78;
  long **local_68;
  mapped_type *local_60;
  long **local_58;
  key_type *local_50;
  mapped_type *local_48;
  mapped_type *local_40;
  long **local_38;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined4 local_10;
  undefined4 local_c;
  undefined4 local_8;
  undefined4 local_4;
  
  local_118 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_158,"id",&local_159);
  XML::parm(in_stack_fffffffffffffc68,(string *)in_stack_fffffffffffffc60);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  bVar1 = std::operator!=(in_stack_fffffffffffffc20,(char *)in_stack_fffffffffffffc18);
  local_2da = false;
  if (bVar1) {
    local_178[0]._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
         ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
                 *)in_stack_fffffffffffffc18,(key_type *)0x3dbace);
    local_180._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
                *)in_stack_fffffffffffffc18);
    local_2da = std::operator!=(local_178,&local_180);
  }
  if (local_2da == false) {
    local_f0 = local_118;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1a8,"parameters",&local_1a9);
    bVar1 = XML::hasChild(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
    std::__cxx11::string::~string(local_1a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      local_f8 = local_118;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1f0,"parameters",&local_1f1);
      XML::child(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
      std::__cxx11::string::~string(local_1f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
      local_200._M_node =
           (_Base_ptr)
           std::
           map<embree::Ref<embree::XML>,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<embree::Ref<embree::XML>_>,_std::allocator<std::pair<const_embree::Ref<embree::XML>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
           ::find(in_stack_fffffffffffffc18,(key_type *)0x3dbfaa);
      local_208._M_node =
           (_Base_ptr)
           std::
           map<embree::Ref<embree::XML>,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<embree::Ref<embree::XML>_>,_std::allocator<std::pair<const_embree::Ref<embree::XML>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
           ::end(in_stack_fffffffffffffc18);
      bVar1 = std::operator!=(&local_200,&local_208);
      if (bVar1) {
        pmVar4 = std::
                 map<embree::Ref<embree::XML>,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<embree::Ref<embree::XML>_>,_std::allocator<std::pair<const_embree::Ref<embree::XML>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
                 ::operator[]((map<embree::Ref<embree::XML>,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<embree::Ref<embree::XML>_>,_std::allocator<std::pair<const_embree::Ref<embree::XML>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
                               *)in_stack_fffffffffffffc60,(key_type *)in_stack_fffffffffffffc58);
        pmVar6 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
                               *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
        local_48 = pmVar4;
        local_40 = pmVar6;
        if (pmVar4->ptr != (MaterialNode *)0x0) {
          (*(pmVar4->ptr->super_Node).super_RefCount._vptr_RefCount[2])();
        }
        if (pmVar6->ptr != (MaterialNode *)0x0) {
          (*(pmVar6->ptr->super_Node).super_RefCount._vptr_RefCount[3])();
        }
        pmVar6->ptr = local_48->ptr;
        (in_RDI->super_Node).super_RefCount._vptr_RefCount = (_func_int **)pmVar6->ptr;
        local_98 = pmVar6;
        if ((in_RDI->super_Node).super_RefCount._vptr_RefCount != (_func_int **)0x0) {
          (**(code **)(*(in_RDI->super_Node).super_RefCount._vptr_RefCount + 0x10))();
        }
        local_184 = 1;
      }
      else {
        local_100 = local_118;
        xml_00 = (Ref<embree::XML> *)*local_118;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_270,"code",&local_271);
        XML::child(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
        load<std::__cxx11::string>(in_stack_fffffffffffffc90,xml_00);
        pcVar5 = (char *)std::__cxx11::string::c_str();
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_228,pcVar5,&local_272);
        std::allocator<char>::~allocator((allocator<char> *)&local_272);
        std::__cxx11::string::~string(local_248);
        local_c8 = &local_250;
        if (local_250 != (long *)0x0) {
          (**(code **)(*local_250 + 0x18))();
        }
        std::__cxx11::string::~string(local_270);
        std::allocator<char>::~allocator((allocator<char> *)&local_271);
        loadMaterialParms(in_stack_00000610,in_stack_00000608);
        addMaterial(in_stack_00000378,in_stack_00000370,in_stack_00000368);
        __k = (key_type *)
              std::
              map<embree::Ref<embree::XML>,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<embree::Ref<embree::XML>_>,_std::allocator<std::pair<const_embree::Ref<embree::XML>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
              ::operator[]((map<embree::Ref<embree::XML>,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<embree::Ref<embree::XML>_>,_std::allocator<std::pair<const_embree::Ref<embree::XML>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
                            *)in_stack_fffffffffffffc60,(key_type *)in_stack_fffffffffffffc58);
        local_58 = local_2b0;
        this_00 = __k;
        local_50 = __k;
        if (local_2b0[0] != (long *)0x0) {
          (**(code **)(*local_2b0[0] + 0x10))();
        }
        if (*(MaterialNode **)__k != (MaterialNode *)0x0) {
          (*((*(MaterialNode **)__k)->super_Node).super_RefCount._vptr_RefCount[3])();
        }
        *(long **)__k = *local_58;
        pmVar6 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
                               *)this_00,__k);
        local_68 = local_2b0;
        local_60 = pmVar6;
        if (local_2b0[0] != (long *)0x0) {
          (**(code **)(*local_2b0[0] + 0x10))();
        }
        if (pmVar6->ptr != (MaterialNode *)0x0) {
          (*(pmVar6->ptr->super_Node).super_RefCount._vptr_RefCount[3])();
        }
        pmVar6->ptr = (MaterialNode *)*local_68;
        (in_RDI->super_Node).super_RefCount._vptr_RefCount = (_func_int **)pmVar6->ptr;
        local_88 = pmVar6;
        if ((in_RDI->super_Node).super_RefCount._vptr_RefCount != (_func_int **)0x0) {
          (**(code **)(*(in_RDI->super_Node).super_RefCount._vptr_RefCount + 0x10))();
        }
        local_184 = 1;
        local_38 = local_2b0;
        if (local_2b0[0] != (long *)0x0) {
          (**(code **)(*local_2b0[0] + 0x18))();
        }
        Parms::~Parms((Parms *)0x3dc51b);
        std::__cxx11::string::~string(local_228);
      }
      local_b8 = &local_1d0;
      if (local_1d0 != (long *)0x0) {
        (**(code **)(*local_1d0 + 0x18))();
      }
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cout,"Warning: material ");
      poVar2 = std::operator<<(poVar2,local_138);
      poVar2 = std::operator<<(poVar2," is not defined");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      pp_Var3 = (_func_int **)SceneGraph::MaterialNode::operator_new(0x3dbd48);
      local_d0 = &local_1c8;
      local_d4 = 0x3f000000;
      local_d8 = 0;
      local_dc = 0;
      local_4 = 0;
      local_8 = 0;
      local_c = 0;
      local_10 = 0x3f000000;
      local_28 = 0x3f000000;
      uStack_20 = 0;
      local_1c8 = 0x3f000000;
      uStack_1c0 = 0;
      MatteMaterial::MatteMaterial(in_stack_fffffffffffffc60,(Vec3fa *)in_stack_fffffffffffffc58);
      (in_RDI->super_Node).super_RefCount._vptr_RefCount = pp_Var3;
      local_78 = pp_Var3;
      if ((in_RDI->super_Node).super_RefCount._vptr_RefCount != (_func_int **)0x0) {
        (**(code **)(*(in_RDI->super_Node).super_RefCount._vptr_RefCount + 0x10))();
      }
      local_184 = 1;
    }
  }
  else {
    local_a8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
                             *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
    (in_RDI->super_Node).super_RefCount._vptr_RefCount = (_func_int **)local_a8->ptr;
    if ((in_RDI->super_Node).super_RefCount._vptr_RefCount != (_func_int **)0x0) {
      (**(code **)(*(in_RDI->super_Node).super_RefCount._vptr_RefCount + 0x10))();
    }
    local_184 = 1;
  }
  std::__cxx11::string::~string(local_138);
  return (Ref<embree::SceneGraph::MaterialNode>)in_RDI;
}

Assistant:

Ref<SceneGraph::MaterialNode> XMLLoader::loadMaterial(const Ref<XML>& xml) 
  {
    const std::string id = xml->parm("id");
    if (id != "" && state.materialMap.find(id) != state.materialMap.end())
      return state.materialMap[id];

    if (!xml->hasChild("parameters")) {
      std::cout << "Warning: material " << id << " is not defined" << std::endl;
      return new MatteMaterial(Vec3fa(0.5f,0.0f,0.0f));
    }
    Ref<XML> parameters = xml->child("parameters");
    if (state.materialCache.find(parameters) != state.materialCache.end()) {
      return state.materialMap[id] = state.materialCache[parameters];
    }

    std::string type = load<std::string>(xml->child("code")).c_str();
    Parms parms = loadMaterialParms(parameters);
    Ref<SceneGraph::MaterialNode> material = addMaterial(type,parms);
    state.materialCache[parameters] = material;
    return state.materialMap[id] = material;
  }